

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_3dmRenderSettings::RenderEnvironmentOverride(ON_3dmRenderSettings *this,EnvironmentUsage usage)

{
  ON_EnvironmentsImpl *this_00;
  bool bVar1;
  ON_EnvironmentsImpl *e;
  EnvironmentUsage usage_local;
  ON_3dmRenderSettings *this_local;
  
  ON_3dmRenderSettingsPrivate::Get(this);
  ON_REMOVE_ASAP_AssertEx
            ((uint)(this->m_private->_environments != (ON_EnvironmentsImpl *)0x0),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
             ,0x6db,"","nullptr != m_private->_environments is false");
  this_00 = this->m_private->_environments;
  if (usage != Background) {
    if (usage == Reflection) {
      bVar1 = ON_EnvironmentsImpl::ReflectionRenderEnvironmentOverride(this_00);
      return bVar1;
    }
    if (usage == Skylighting) {
      bVar1 = ON_EnvironmentsImpl::SkylightingRenderEnvironmentOverride(this_00);
      return bVar1;
    }
  }
  return this->m_background_style == 3;
}

Assistant:

bool ON_3dmRenderSettings::RenderEnvironmentOverride(EnvironmentUsage usage) const
{
  ON_3dmRenderSettingsPrivate::Get(*this);

  // The pointer is never null.
  ON_ASSERT(nullptr != m_private->_environments);

  const auto& e = *m_private->_environments;
  switch (usage)
  {
  default:
  case EnvironmentUsage::Background:  return m_background_style == 3;
  case EnvironmentUsage::Reflection:  return e.ReflectionRenderEnvironmentOverride();
  case EnvironmentUsage::Skylighting: return e.SkylightingRenderEnvironmentOverride();
  }
}